

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# residual_functions.h
# Opt level: O2

vector<double,_std::allocator<double>_> * __thiscall
IsobarImposedRho0VLEResiduals<double>::call
          (vector<double,_std::allocator<double>_> *__return_storage_ptr__,
          IsobarImposedRho0VLEResiduals<double> *this,
          vector<double,_std::allocator<double>_> *lnrhovec)

{
  vector<double,_std::allocator<double>_> *this_00;
  double *pdVar1;
  MixDerivs<double> *this_01;
  MixDerivs<double> *this_02;
  pointer pdVar2;
  undefined8 uVar3;
  CoeffReturnType pdVar4;
  CoolPropError<(CoolProp::CoolPropBaseError::ErrCode)4> *this_03;
  ulong uVar5;
  long vecSize;
  double dVar6;
  allocator local_e9;
  double local_e8;
  double local_e0;
  double T;
  double local_d0;
  ArrayXd rhovecL;
  ArrayXd rhovecV;
  _Any_data local_a8 [2];
  double local_88;
  double local_80;
  double local_78;
  double local_70;
  double local_68;
  double local_60;
  vector<double,_std::allocator<double>_> _rhovecL;
  vector<double,_std::allocator<double>_> _rhovecV;
  
  _rhovecL.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  _rhovecL.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  _rhovecL.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  _rhovecV.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  _rhovecV.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  _rhovecV.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  unpack(this,lnrhovec,&T,&_rhovecL,&_rhovecV);
  vecSize = (long)_rhovecL.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)_rhovecL.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start >> 3;
  Eigen::
  MapBase<Eigen::Map<const_Eigen::Array<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>::
  MapBase((MapBase<Eigen::Map<const_Eigen::Array<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
           *)local_a8,
          _rhovecL.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start,vecSize);
  Eigen::PlainObjectBase<Eigen::Array<double,-1,1,0,-1,1>>::
  PlainObjectBase<Eigen::Map<Eigen::Array<double,_1,1,0,_1,1>const,0,Eigen::Stride<0,0>>>
            ((PlainObjectBase<Eigen::Array<double,_1,1,0,_1,1>> *)&rhovecL,
             (DenseBase<Eigen::Map<const_Eigen::Array<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>
              *)local_a8[0]._M_pod_data);
  Eigen::
  MapBase<Eigen::Map<const_Eigen::Array<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>::
  MapBase((MapBase<Eigen::Map<const_Eigen::Array<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
           *)local_a8,
          _rhovecV.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start,vecSize);
  Eigen::PlainObjectBase<Eigen::Array<double,-1,1,0,-1,1>>::
  PlainObjectBase<Eigen::Map<Eigen::Array<double,_1,1,0,_1,1>const,0,Eigen::Stride<0,0>>>
            ((PlainObjectBase<Eigen::Array<double,_1,1,0,_1,1>> *)&rhovecV,
             (DenseBase<Eigen::Map<const_Eigen::Array<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>
              *)local_a8[0]._M_pod_data);
  std::
  function<std::unique_ptr<const_MixDerivs<double>,_std::default_delete<const_MixDerivs<double>_>_>_(double,_const_Eigen::Array<double,_-1,_1,_0,_-1,_1>_&)>
  ::operator()((function<std::unique_ptr<const_MixDerivs<double>,_std::default_delete<const_MixDerivs<double>_>_>_(double,_const_Eigen::Array<double,__1,_1,_0,__1,_1>_&)>
                *)local_a8,T,(Array<double,__1,_1,_0,__1,_1> *)&this->m_factory);
  uVar3 = local_a8[0]._M_unused._0_8_;
  local_a8[0]._M_unused._M_object = (pointer)0x0;
  std::__uniq_ptr_impl<const_MixDerivs<double>,_std::default_delete<const_MixDerivs<double>_>_>::
  reset((__uniq_ptr_impl<const_MixDerivs<double>,_std::default_delete<const_MixDerivs<double>_>_> *)
        &this->m_derL,(pointer)uVar3);
  std::unique_ptr<const_MixDerivs<double>,_std::default_delete<const_MixDerivs<double>_>_>::
  ~unique_ptr((unique_ptr<const_MixDerivs<double>,_std::default_delete<const_MixDerivs<double>_>_> *
              )local_a8);
  std::
  function<std::unique_ptr<const_MixDerivs<double>,_std::default_delete<const_MixDerivs<double>_>_>_(double,_const_Eigen::Array<double,_-1,_1,_0,_-1,_1>_&)>
  ::operator()((function<std::unique_ptr<const_MixDerivs<double>,_std::default_delete<const_MixDerivs<double>_>_>_(double,_const_Eigen::Array<double,__1,_1,_0,__1,_1>_&)>
                *)local_a8,T,(Array<double,__1,_1,_0,__1,_1> *)&this->m_factory);
  uVar3 = local_a8[0]._M_unused._0_8_;
  local_a8[0]._M_unused._M_object = (void *)0x0;
  std::__uniq_ptr_impl<const_MixDerivs<double>,_std::default_delete<const_MixDerivs<double>_>_>::
  reset((__uniq_ptr_impl<const_MixDerivs<double>,_std::default_delete<const_MixDerivs<double>_>_> *)
        &this->m_derV,(pointer)uVar3);
  std::unique_ptr<const_MixDerivs<double>,_std::default_delete<const_MixDerivs<double>_>_>::
  ~unique_ptr((unique_ptr<const_MixDerivs<double>,_std::default_delete<const_MixDerivs<double>_>_> *
              )local_a8);
  this_01 = (this->m_derL)._M_t.
            super___uniq_ptr_impl<const_MixDerivs<double>,_std::default_delete<const_MixDerivs<double>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_const_MixDerivs<double>_*,_std::default_delete<const_MixDerivs<double>_>_>
            .super__Head_base<0UL,_const_MixDerivs<double>_*,_false>._M_head_impl;
  this_02 = (this->m_derV)._M_t.
            super___uniq_ptr_impl<const_MixDerivs<double>,_std::default_delete<const_MixDerivs<double>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_const_MixDerivs<double>_*,_std::default_delete<const_MixDerivs<double>_>_>
            .super__Head_base<0UL,_const_MixDerivs<double>_*,_false>._M_head_impl;
  local_e0 = this_01->R;
  local_60 = MixDerivs<double>::p(this_01);
  local_e8 = MixDerivs<double>::dpsir_drhoi__constTrhoj(this_01,0);
  local_d0 = MixDerivs<double>::dpsir_drhoi__constTrhoj(this_01,1);
  local_70 = MixDerivs<double>::p(this_02);
  local_68 = MixDerivs<double>::dpsir_drhoi__constTrhoj(this_02,0);
  local_78 = MixDerivs<double>::dpsir_drhoi__constTrhoj(this_02,1);
  this_00 = &this->y;
  std::vector<double,_std::allocator<double>_>::resize(this_00,5);
  local_80 = T * local_e0;
  pdVar4 = Eigen::DenseCoeffsBase<Eigen::Array<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
                     ((DenseCoeffsBase<Eigen::Array<double,__1,_1,_0,__1,_1>,_0> *)&rhovecL,0);
  local_88 = *pdVar4;
  pdVar4 = Eigen::DenseCoeffsBase<Eigen::Array<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
                     ((DenseCoeffsBase<Eigen::Array<double,__1,_1,_0,__1,_1>,_0> *)&rhovecV,0);
  local_e8 = local_e8 - local_68;
  dVar6 = log(local_88 / *pdVar4);
  *(this_00->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
   _M_start = local_80 * dVar6 + local_e8;
  local_e0 = local_e0 * T;
  pdVar4 = Eigen::DenseCoeffsBase<Eigen::Array<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
                     ((DenseCoeffsBase<Eigen::Array<double,__1,_1,_0,__1,_1>,_0> *)&rhovecL,1);
  local_e8 = *pdVar4;
  pdVar4 = Eigen::DenseCoeffsBase<Eigen::Array<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
                     ((DenseCoeffsBase<Eigen::Array<double,__1,_1,_0,__1,_1>,_0> *)&rhovecV,1);
  local_d0 = local_d0 - local_78;
  dVar6 = log(local_e8 / *pdVar4);
  pdVar2 = (this->y).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar2[1] = local_e0 * dVar6 + local_d0;
  pdVar2[2] = local_60 - this->m_p;
  pdVar2[3] = local_70 - this->m_p;
  pdVar4 = Eigen::DenseCoeffsBase<Eigen::Array<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
                     ((DenseCoeffsBase<Eigen::Array<double,__1,_1,_0,__1,_1>,_0> *)&rhovecL,
                      this->m_imposed_index);
  pdVar2 = (this->y).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar2[4] = *pdVar4 - this->m_rho0;
  uVar5 = 0;
  do {
    if ((ulong)((long)(this->y).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)pdVar2 >> 3) <= uVar5) {
      std::vector<double,_std::allocator<double>_>::vector(__return_storage_ptr__,this_00);
      free(rhovecV.super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
      free(rhovecL.super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                (&_rhovecV.super__Vector_base<double,_std::allocator<double>_>);
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                (&_rhovecL.super__Vector_base<double,_std::allocator<double>_>);
      return __return_storage_ptr__;
    }
    pdVar1 = pdVar2 + uVar5;
    uVar5 = uVar5 + 1;
  } while (ABS(*pdVar1) <= 1.79769313486232e+308);
  this_03 = (CoolPropError<(CoolProp::CoolPropBaseError::ErrCode)4> *)__cxa_allocate_exception(0x30)
  ;
  std::__cxx11::string::string((string *)local_a8[0]._M_pod_data,"Invalid value found",&local_e9);
  CoolProp::CoolPropError<(CoolProp::CoolPropBaseError::ErrCode)4>::CoolPropError
            (this_03,(string *)local_a8,eValue);
  __cxa_throw(this_03,&CoolProp::CoolPropError<(CoolProp::CoolPropBaseError::ErrCode)4>::typeinfo,
              CoolProp::CoolPropBaseError::~CoolPropBaseError);
}

Assistant:

std::vector<TYPE> call(const std::vector<TYPE> &lnrhovec) {
        TYPE T; std::vector<TYPE> _rhovecL, _rhovecV;
        unpack(lnrhovec, T, _rhovecL, _rhovecV);

        auto N = _rhovecL.size();
        const Eigen::ArrayXd rhovecL = Eigen::Map<const Eigen::ArrayXd>(&(_rhovecL[0]), N);
        const Eigen::ArrayXd rhovecV = Eigen::Map<const Eigen::ArrayXd>(&(_rhovecV[0]), N);

        m_derL = m_factory(T, rhovecL);
        m_derV = m_factory(T, rhovecV);
        auto &derL = *(m_derL.get()), &derV = *(m_derV.get()); TYPE R = derL.R;

        TYPE pL = derL.p(), chempotr0L = derL.dpsir_drhoi__constTrhoj(0), chempotr1L = derL.dpsir_drhoi__constTrhoj(1);
        TYPE pV = derV.p(), chempotr0V = derV.dpsir_drhoi__constTrhoj(0), chempotr1V = derV.dpsir_drhoi__constTrhoj(1);

        y.resize(5);
        y[0] = chempotr0L - chempotr0V + R*T*log(rhovecL[0] / rhovecV[0]);
        y[1] = chempotr1L - chempotr1V + R*T*log(rhovecL[1] / rhovecV[1]);
        y[2] = pL - m_p;
        y[3] = pV - m_p;
        y[4] = rhovecL[m_imposed_index] - m_rho0;
        for (std::size_t i = 0; i < y.size(); ++i) {
            if (!ValidNumber(y[i])) {
                throw ValueError("Invalid value found");
            }
        }
        return y;
    }